

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.c
# Opt level: O1

void xmlACatalogDump(xmlCatalogPtr catal,FILE *out)

{
  xmlCatalogEntryPtr catal_00;
  xmlDocPtr doc;
  xmlDtdPtr cur;
  xmlNsPtr ns;
  xmlNodePtr cur_00;
  xmlOutputBufferPtr buf;
  
  if (catal != (xmlCatalogPtr)0x0 && out != (FILE *)0x0) {
    if (catal->type != XML_XML_CATALOG_TYPE) {
      xmlHashScan(catal->sgml,xmlCatalogDumpEntry,out);
      return;
    }
    catal_00 = catal->xml;
    doc = xmlNewDoc((xmlChar *)0x0);
    if (doc != (xmlDocPtr)0x0) {
      cur = xmlNewDtd(doc,"catalog",
                      (xmlChar *)"-//OASIS//DTD Entity Resolution XML Catalog V1.0//EN",
                      (xmlChar *)
                      "http://www.oasis-open.org/committees/entity/release/1.0/catalog.dtd");
      xmlAddChild((xmlNodePtr)doc,(xmlNodePtr)cur);
      ns = xmlNewNs((xmlNodePtr)0x0,(xmlChar *)"urn:oasis:names:tc:entity:xmlns:xml:catalog",
                    (xmlChar *)0x0);
      if (ns != (xmlNsPtr)0x0) {
        cur_00 = xmlNewDocNode(doc,ns,"catalog",(xmlChar *)0x0);
        if (cur_00 == (xmlNodePtr)0x0) {
          xmlFreeNs(ns);
        }
        else {
          cur_00->nsDef = ns;
          xmlAddChild((xmlNodePtr)doc,cur_00);
          xmlDumpXMLCatalogNode(catal_00,cur_00,doc,ns,(xmlCatalogEntryPtr)0x0);
          buf = xmlOutputBufferCreateFile(out,(xmlCharEncodingHandlerPtr)0x0);
          if (buf != (xmlOutputBufferPtr)0x0) {
            xmlSaveFormatFileTo(buf,doc,(char *)0x0,1);
          }
        }
      }
      xmlFreeDoc(doc);
      return;
    }
  }
  return;
}

Assistant:

void
xmlACatalogDump(xmlCatalogPtr catal, FILE *out) {
    if ((out == NULL) || (catal == NULL))
	return;

    if (catal->type == XML_XML_CATALOG_TYPE) {
	xmlDumpXMLCatalog(out, catal->xml);
    } else {
	xmlHashScan(catal->sgml, xmlCatalogDumpEntry, out);
    }
}